

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall
capnp::_::OrphanBuilder::copy(OrphanBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  WirePointer *dst_00;
  SegmentAnd<capnp::word_*> SVar1;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  WirePointer *in_stack_00000018;
  int in_stack_00000020;
  SegmentAnd<capnp::word_*> allocation;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  OrphanBuilder(this);
  dst_00 = tagAsPtr(this);
  SVar1 = WireHelpers::copyPointer
                    ((SegmentBuilder *)0x0,(CapTableBuilder *)src,dst_00,in_stack_00000008,
                     in_stack_00000010,in_stack_00000018,in_stack_00000020,(BuilderArena *)dst,false
                    );
  this->segment = SVar1.segment;
  this->capTable = (CapTableBuilder *)src;
  this->location = SVar1.value;
  return (int)this;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, PointerReader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::copyPointer(
      nullptr, capTable, result.tagAsPtr(),
      copyFrom.segment, copyFrom.capTable, copyFrom.pointer, copyFrom.nestingLimit, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value);
  return result;
}